

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O0

size_t __thiscall lattice::supercell::offset2lcord(supercell *this,offset_t *offset)

{
  CoeffReturnType plVar1;
  long lVar2;
  long *in_RDI;
  size_t m;
  size_t lc;
  Index in_stack_ffffffffffffffc8;
  DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_0> *in_stack_ffffffffffffffd0;
  long local_20;
  DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_0> *local_18;
  
  local_18 = (DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_0> *)0x0;
  for (local_20 = *in_RDI; local_20 != 0; local_20 = local_20 + -1) {
    plVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_0>::operator()
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffc8 = *plVar1;
    plVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_0>::operator()
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    lVar2 = in_stack_ffffffffffffffc8 - *plVar1;
    plVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_0>::operator()
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd0 = (DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_0> *)*plVar1;
    plVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_0>::operator()
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_18 = in_stack_ffffffffffffffd0 + (lVar2 * (long)local_18 - *plVar1);
  }
  return (size_t)local_18;
}

Assistant:

std::size_t offset2lcord(const offset_t& offset) const {
    std::size_t lc = 0;
    for (std::size_t m = dim_; m > 0; --m) {
      lc *= (nmax_(m-1) - nmin_(m-1));
      lc += (offset(m-1) - nmin_(m-1));
    }
    return lc;
  }